

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
run_default_dispatcher_and_go_further
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,env_init_t *init_fn)

{
  allocator local_71;
  anon_class_8_1_8991fb9c local_70;
  anon_class_8_1_8991fb9c local_68;
  string local_60;
  anon_class_40_2_424c5504 local_40;
  
  std::__cxx11::string::string((string *)&local_60,"run_default_dispatcher",&local_71);
  local_70.this = this;
  local_68.this = this;
  local_40.this = this;
  std::function<void_()>::function(&local_40.init_fn,init_fn);
  so_5::impl::
  run_stage<so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_1_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_2_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_3_>
            (&local_60,&local_68,&local_70,&local_40);
  std::_Function_base::~_Function_base(&local_40.init_fn.super__Function_base);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_disp.set_data_sources_name_base( "DEFAULT" );
					m_default_disp.start( m_env );
				},
				[this] {
					m_default_disp.shutdown();
					m_default_disp.wait();
				},
				[this, init_fn] {
					run_user_supplied_init_and_do_main_loop( std::move(init_fn) );
				} );
	}